

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void el::base::utils::Str::replaceFirstWithEscape
               (string_t *str,string_t *replaceWhat,string_t *replaceWith)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = ::std::__cxx11::string::find((string *)str,(ulong)replaceWhat);
    if (uVar1 == 0xffffffffffffffff) {
      return;
    }
    if ((uVar1 == 0) || ((str->_M_dataplus)._M_p[uVar1 - 1] != '%')) break;
    ::std::__cxx11::string::erase((ulong)str,uVar1 - 1);
  }
  ::std::__cxx11::string::replace((ulong)str,uVar1,(string *)replaceWhat->_M_string_length);
  return;
}

Assistant:

void Str::replaceFirstWithEscape(base::type::string_t& str, const base::type::string_t& replaceWhat,
                                 const base::type::string_t& replaceWith) {
  std::size_t foundAt = base::type::string_t::npos;
  while ((foundAt = str.find(replaceWhat, foundAt + 1)) != base::type::string_t::npos) {
    if (foundAt > 0 && str[foundAt - 1] == base::consts::kFormatSpecifierChar) {
      str.erase(foundAt > 0 ? foundAt - 1 : 0, 1);
      ++foundAt;
    } else {
      str.replace(foundAt, replaceWhat.length(), replaceWith);
      return;
    }
  }
}